

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3_step(sqlite3_stmt *pStmt)

{
  int iVar1;
  ushort uVar2;
  undefined2 uVar3;
  sqlite3 *db;
  sqlite3 *db_00;
  uint *puVar4;
  Btree *p;
  Wal *pWVar5;
  sqlite3_stmt sVar6;
  char cVar7;
  int iVar8;
  uint uVar9;
  undefined4 uVar10;
  int iVar11;
  undefined8 *puVar12;
  byte *pbVar13;
  uchar *z;
  char *pcVar14;
  ulong uVar15;
  char *pcVar16;
  int iVar17;
  ulong uVar18;
  undefined8 uVar19;
  byte bVar20;
  int iVar21;
  u32 uVar22;
  Mem *pMVar23;
  sqlite3_stmt *psVar24;
  byte *pbVar25;
  uint uVar26;
  ulong uVar27;
  long lVar28;
  int i;
  long lVar29;
  long lVar30;
  sqlite3 *psVar31;
  bool bVar32;
  int rc;
  int local_9c;
  StrAccum local_98;
  sqlite3 *local_70;
  sqlite3 *local_68;
  uint local_60;
  int local_5c;
  long local_58;
  Mem *local_50;
  sqlite3_stmt *local_48;
  ulong local_40;
  sqlite3_stmt *local_38;
  
  iVar8 = vdbeSafetyNotNull((Vdbe *)pStmt);
  if (iVar8 != 0) {
    iVar8 = sqlite3MisuseError(0x1648f);
    return iVar8;
  }
  db = *(sqlite3 **)pStmt;
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  local_48 = pStmt + 0xb8;
  local_38 = pStmt + 0x88;
  local_9c = 0;
  do {
    uVar9 = 1;
    psVar31 = *(sqlite3 **)pStmt;
    sVar6 = pStmt[199];
    if (sVar6 != (sqlite3_stmt)0x2) {
      while (sVar6 == (sqlite3_stmt)0x3) {
        sqlite3_reset(pStmt);
        sVar6 = pStmt[199];
      }
      if (sVar6 != (sqlite3_stmt)0x1) goto LAB_00118c8a;
      if (((byte)pStmt[200] & 3) == 0) {
        iVar8 = psVar31->nVdbeActive;
        if (iVar8 == 0) {
          (psVar31->u1).isInterrupted = 0;
        }
        if ((((psVar31->mTrace & 0x82) != 0) && ((psVar31->init).busy == '\0')) &&
           (*(long *)(pStmt + 0xf8) != 0)) {
          sqlite3OsCurrentTimeInt64(psVar31->pVfs,(sqlite3_int64 *)local_48);
          iVar8 = psVar31->nVdbeActive;
        }
        psVar31->nVdbeActive = iVar8 + 1;
        cVar7 = (char)*(ushort *)(pStmt + 200);
        if ((*(ushort *)(pStmt + 200) & 0x40) == 0) {
          psVar31->nVdbeWrite = psVar31->nVdbeWrite + 1;
          cVar7 = (char)*(undefined2 *)(pStmt + 200);
        }
        if (cVar7 < '\0') {
          psVar31->nVdbeRead = psVar31->nVdbeRead + 1;
        }
        *(undefined4 *)(pStmt + 0x30) = 0;
        pStmt[199] = (sqlite3_stmt)0x2;
        goto LAB_00118c8a;
      }
      *(undefined4 *)(pStmt + 0x34) = 0x11;
      if ((char)pStmt[0xc6] < '\0') {
        uVar9 = sqlite3VdbeTransferError((Vdbe *)pStmt);
      }
      goto LAB_001194bf;
    }
LAB_00118c8a:
    if ((*(ushort *)(pStmt + 200) & 0xc) == 0) {
      psVar31->nVdbeExec = psVar31->nVdbeExec + 1;
      uVar9 = sqlite3VdbeExec((Vdbe *)pStmt);
      psVar31->nVdbeExec = psVar31->nVdbeExec + -1;
      if (uVar9 != 100) goto LAB_00119386;
      goto LAB_00119545;
    }
    db_00 = *(sqlite3 **)pStmt;
    bVar20 = 1;
    if ((*(ushort *)(pStmt + 200) & 0xc) != 4) {
      bVar20 = *(byte *)((long)&db_00->flags + 3) & 1;
    }
    local_58 = *(long *)(pStmt + 0x68);
    local_50 = (Mem *)(local_58 + 0x38);
    releaseMemArray(local_50,8);
    if (*(int *)(pStmt + 0x34) == 7) {
      sqlite3OomFault(db_00);
      goto LAB_00119386;
    }
    if (bVar20 == 0) {
      pMVar23 = (Mem *)0x0;
    }
    else {
      pMVar23 = (Mem *)(*(long *)(pStmt + 0x68) + 0x1f8);
    }
    iVar8 = *(int *)(pStmt + 0x90);
    if (pMVar23 == (Mem *)0x0) {
      uVar27 = 0;
      pcVar14 = (char *)0x0;
    }
    else {
      if ((pMVar23->flags & 0x10) == 0) {
        uVar27 = 0;
        pcVar14 = (char *)0x0;
      }
      else {
        uVar27 = (ulong)(uint)(pMVar23->n >> 3);
        pcVar14 = pMVar23->z;
      }
      uVar15 = 0;
      if (0 < (int)uVar27) {
        uVar15 = uVar27;
      }
      for (uVar18 = 0; uVar15 != uVar18; uVar18 = uVar18 + 1) {
        iVar8 = iVar8 + *(int *)(*(long *)(pcVar14 + uVar18 * 8) + 8);
      }
    }
    uVar26 = *(ushort *)(pStmt + 200) & 0xc;
    iVar11 = *(int *)(pStmt + 0x30);
    local_70 = db_00;
    local_68 = psVar31;
    local_60 = uVar26;
    do {
      iVar1 = iVar11 + 1;
      if (iVar8 <= iVar11) {
        *(undefined4 *)(pStmt + 0x34) = 0;
        uVar9 = 0x65;
LAB_00118f7f:
        *(int *)(pStmt + 0x30) = iVar1;
        psVar31 = local_68;
        goto LAB_00119386;
      }
      pcVar16 = pcVar14;
      psVar24 = local_38;
      iVar17 = iVar11;
      iVar21 = iVar11 - *(int *)(pStmt + 0x90);
      if (*(int *)(pStmt + 0x90) <= iVar11) {
        while( true ) {
          iVar17 = iVar21;
          psVar24 = *(sqlite3_stmt **)pcVar16;
          if (iVar17 < *(int *)(psVar24 + 8)) break;
          pcVar16 = pcVar16 + 8;
          iVar21 = iVar17 - *(int *)(psVar24 + 8);
        }
      }
      lVar28 = *(long *)psVar24;
      lVar30 = (long)iVar17;
      if ((pMVar23 != (Mem *)0x0) && (*(char *)(lVar28 + 1 + lVar30 * 0x18) == -4)) {
        lVar29 = lVar30 * 0x18 + lVar28;
        iVar17 = (int)uVar27;
        iVar21 = iVar17 * 8 + 8;
        uVar15 = 0;
        if (0 < iVar17) {
          uVar15 = uVar27;
        }
        for (uVar18 = 0; uVar15 != uVar18; uVar18 = uVar18 + 1) {
          if (*(long *)(pcVar14 + uVar18 * 8) == *(long *)(lVar29 + 0x10)) {
            uVar15 = uVar18 & 0xffffffff;
            break;
          }
        }
        if ((int)uVar15 == iVar17) {
          local_5c = iVar21;
          local_40 = uVar27;
          iVar21 = sqlite3VdbeMemGrow(pMVar23,iVar21,(uint)(iVar17 != 0));
          *(int *)(pStmt + 0x34) = iVar21;
          if (iVar21 != 0) {
            uVar9 = 1;
            goto LAB_00118f7f;
          }
          pcVar14 = pMVar23->z;
          *(undefined8 *)(pcVar14 + (long)(int)local_40 * 8) = *(undefined8 *)(lVar29 + 0x10);
          uVar3 = pMVar23->flags;
          pMVar23->flags = uVar3 & 0xf240 | 0x10;
          pMVar23->n = local_5c;
          iVar8 = iVar8 + *(int *)(*(long *)(lVar29 + 0x10) + 8);
          uVar27 = (ulong)(iVar17 + 1);
          uVar26 = local_60;
        }
      }
      psVar31 = local_70;
      uVar9 = 1;
    } while ((((short)uVar26 == 8) && (cVar7 = *(char *)(lVar28 + lVar30 * 0x18), cVar7 != -0x44))
            && ((bVar32 = iVar11 < 1, iVar11 = iVar1, bVar32 || (cVar7 != '\b'))));
    *(int *)(pStmt + 0x30) = iVar1;
    if ((local_70->u1).isInterrupted != 0) {
      *(undefined4 *)(pStmt + 0x34) = 9;
      sqlite3VdbeError((Vdbe *)pStmt,"interrupted");
      psVar31 = local_68;
      goto LAB_00119386;
    }
    local_98.db = (sqlite3 *)0x0;
    local_98.zText = (char *)0x0;
    local_98.nAlloc = 0;
    local_98.mxAlloc = 1000000000;
    local_98.nChar = 0;
    local_98.accError = '\0';
    local_98.printfFlags = '\0';
    pbVar25 = (byte *)(lVar28 + lVar30 * 0x18);
    pcVar14 = "program";
    switch(pbVar25[1]) {
    case 0xf1:
      pcVar14 = *(char **)(*(long *)(pbVar25 + 0x10) + 8);
      goto LAB_001191e0;
    case 0xf2:
      puVar4 = *(uint **)(pbVar25 + 0x10);
      uVar26 = *puVar4;
      for (; uVar9 <= uVar26; uVar9 = uVar9 + 1) {
        uVar19 = 0x2c;
        if (uVar9 == 1) {
          uVar19 = 0x5b;
        }
        sqlite3_str_appendf(&local_98,"%c%u",uVar19,(ulong)puVar4[uVar9]);
      }
      sqlite3_str_append(&local_98,"]",1);
      psVar31 = local_70;
      break;
    case 0xf3:
      puVar12 = *(undefined8 **)(pbVar25 + 0x10);
      goto LAB_0011918c;
    case 0xf4:
      puVar12 = *(undefined8 **)(pbVar25 + 0x10);
LAB_001191b0:
      sqlite3_str_appendf(&local_98,"%.16g",(int)*puVar12);
      break;
    case 0xf5:
      uVar19 = *(undefined8 *)(*(long *)(pbVar25 + 0x10) + 0x10);
      pcVar14 = "vtab:%p";
      goto LAB_0011919b;
    case 0xf6:
      puVar12 = *(undefined8 **)(pbVar25 + 0x10);
      uVar2 = *(ushort *)((long)puVar12 + 0x14);
      if ((uVar2 & 2) != 0) {
        pbVar13 = (byte *)(puVar12 + 1);
        goto LAB_0011920e;
      }
      if ((uVar2 & 0x24) == 0) {
        if ((uVar2 & 8) == 0) {
          pcVar14 = "NULL";
          if ((uVar2 & 1) == 0) {
            pcVar14 = "(blob)";
          }
          goto switchD_00118f63_caseD_fc;
        }
        goto LAB_001191b0;
      }
LAB_0011918c:
      uVar19 = *puVar12;
      pcVar14 = "%lld";
LAB_0011919b:
      sqlite3_str_appendf(&local_98,pcVar14,uVar19);
      break;
    default:
      pbVar13 = pbVar25 + 0x10;
      goto LAB_0011920e;
    case 0xf8:
      lVar28 = *(long *)(pbVar25 + 0x10);
      sqlite3_str_appendf(&local_98,"k(%d",(ulong)*(ushort *)(lVar28 + 6));
      for (uVar27 = 0; uVar27 < *(ushort *)(lVar28 + 6); uVar27 = uVar27 + 1) {
        puVar12 = *(undefined8 **)(lVar28 + 0x20 + uVar27 * 8);
        pcVar14 = "";
        if (puVar12 != (undefined8 *)0x0) {
          pcVar14 = (char *)*puVar12;
        }
        strcmp(pcVar14,"BINARY");
        bVar20 = *(byte *)(*(long *)(lVar28 + 0x18) + uVar27);
        pcVar14 = "-";
        if ((bVar20 & 1) == 0) {
          pcVar14 = "";
        }
        pcVar16 = "N.";
        if ((bVar20 & 2) == 0) {
          pcVar16 = "";
        }
        sqlite3_str_appendf(&local_98,",%s%s%s",pcVar14,pcVar16);
      }
      sqlite3_str_append(&local_98,")",1);
      psVar31 = local_70;
      break;
    case 0xf9:
      pcVar14 = *(char **)(pbVar25 + 0x10);
LAB_001191e0:
      sqlite3_str_appendf(&local_98,"%s(%d)",*(undefined8 *)(pcVar14 + 0x38),
                          (ulong)(uint)(int)*pcVar14);
      break;
    case 0xfb:
      pbVar13 = *(byte **)(pbVar25 + 0x10);
LAB_0011920e:
      pcVar14 = *(char **)pbVar13;
      if (pcVar14 != (char *)0x0) {
switchD_00118f63_caseD_fc:
        sqlite3_str_appendall(&local_98,pcVar14);
      }
      break;
    case 0xfc:
      goto switchD_00118f63_caseD_fc;
    case 0xfd:
      sqlite3_str_appendf(&local_98,"%d",(ulong)*(uint *)(pbVar25 + 0x10));
      break;
    case 0xfe:
      sqlite3_str_appendf(&local_98,"%.18s-%s",**(undefined8 **)(pbVar25 + 0x10),
                          sqlite3VdbeDisplayP4_encnames_rel +
                          *(int *)(sqlite3VdbeDisplayP4_encnames_rel +
                                  (ulong)*(byte *)(*(undefined8 **)(pbVar25 + 0x10) + 1) * 4));
    }
    if ((local_98._28_2_ & 7) != 0) {
      sqlite3OomFault(psVar31);
    }
    pcVar14 = sqlite3StrAccumFinish(&local_98);
    pMVar23 = local_50;
    if ((*(ushort *)(pStmt + 200) & 0xc) == 8) {
      sqlite3VdbeMemSetInt64(local_50,(long)*(int *)(pbVar25 + 4));
      lVar28 = local_58;
      sqlite3VdbeMemSetInt64((Mem *)(local_58 + 0x70),(long)*(int *)(pbVar25 + 8));
      sqlite3VdbeMemSetInt64((Mem *)(lVar28 + 0xa8),(long)*(int *)(pbVar25 + 0xc));
      lVar30 = 0xe0;
    }
    else {
      sqlite3VdbeMemSetInt64(local_50,lVar30);
      lVar28 = local_58;
      sqlite3VdbeMemSetStr
                ((Mem *)(local_58 + 0x70),
                 sqlite3OpcodeName_azName_rel +
                 *(int *)(sqlite3OpcodeName_azName_rel + (ulong)*pbVar25 * 4),-1,'\x01',
                 (_func_void_void_ptr *)0x0);
      sqlite3VdbeMemSetInt64((Mem *)(lVar28 + 0xa8),(long)*(int *)(pbVar25 + 4));
      sqlite3VdbeMemSetInt64((Mem *)(lVar28 + 0xe0),(long)*(int *)(pbVar25 + 8));
      sqlite3VdbeMemSetInt64((Mem *)(lVar28 + 0x118),(long)*(int *)(pbVar25 + 0xc));
      sqlite3VdbeMemSetInt64((Mem *)(lVar28 + 0x188),(ulong)*(ushort *)(pbVar25 + 2));
      sqlite3VdbeMemSetNull((Mem *)(lVar28 + 0x1c0));
      lVar30 = 0x150;
    }
    sqlite3VdbeMemSetStr((Mem *)(lVar28 + lVar30),pcVar14,-1,'\x01',sqlite3_free);
    *(Mem **)(pStmt + 0xa0) = pMVar23;
    bVar32 = local_70->mallocFailed == '\0';
    uVar10 = 7;
    if (bVar32) {
      uVar10 = 0;
    }
    *(undefined4 *)(pStmt + 0x34) = uVar10;
    psVar31 = local_68;
    uVar9 = 1;
    if (bVar32) {
LAB_00119545:
      psVar31->errCode = 100;
      uVar9 = 100;
      goto LAB_00119550;
    }
LAB_00119386:
    if (0 < *(long *)local_48) {
      invokeProfileCallback(psVar31,(Vdbe *)pStmt);
    }
    *(undefined8 *)(pStmt + 0xa0) = 0;
    if (uVar9 == 0x65) {
      uVar9 = 0x65;
      if (psVar31->autoCommit != '\0') {
        lVar28 = 0;
        iVar8 = 0;
        for (lVar30 = 0; lVar30 < psVar31->nDb; lVar30 = lVar30 + 1) {
          p = *(Btree **)((long)&psVar31->aDb->pBt + lVar28);
          if (p != (Btree *)0x0) {
            sqlite3BtreeEnter(p);
            pWVar5 = p->pBt->pPager->pWal;
            if (pWVar5 == (Wal *)0x0) {
              uVar22 = 0;
            }
            else {
              uVar22 = pWVar5->iCallback;
              pWVar5->iCallback = 0;
            }
            sqlite3BtreeLeave(p);
            if (((0 < (int)uVar22) &&
                (psVar31->xWalCallback != (_func_int_void_ptr_sqlite3_ptr_char_ptr_int *)0x0)) &&
               (iVar8 == 0)) {
              iVar8 = (*psVar31->xWalCallback)
                                (psVar31->pWalArg,psVar31,
                                 *(char **)((long)&psVar31->aDb->zDbSName + lVar28),uVar22);
            }
          }
          lVar28 = lVar28 + 0x20;
        }
        *(int *)(pStmt + 0x34) = iVar8;
        uVar9 = 1;
        if (iVar8 == 0) {
          uVar9 = 0x65;
        }
      }
    }
    else if ((char)pStmt[0xc6] < '\0') {
      uVar9 = sqlite3VdbeTransferError((Vdbe *)pStmt);
    }
    psVar31->errCode = uVar9;
    iVar8 = sqlite3ApiExit(*(sqlite3 **)pStmt,*(int *)(pStmt + 0x34));
    if ((iVar8 == 7) && (*(undefined4 *)(pStmt + 0x34) = 7, (char)pStmt[0xc6] < '\0')) {
      uVar9 = 7;
    }
LAB_001194bf:
    uVar9 = uVar9 & psVar31->errMask;
    if (uVar9 != 0x11) goto LAB_00119550;
    if (local_9c == 0x32) {
      uVar9 = 0x11;
      goto LAB_00119550;
    }
    iVar8 = *(int *)(pStmt + 0x30);
    iVar11 = sqlite3Reprepare((Vdbe *)pStmt);
    if (iVar11 != 0) {
      z = sqlite3_value_text(db->pErr);
      sqlite3DbFree(db,*(void **)(pStmt + 0xa8));
      if (db->mallocFailed == '\0') {
        pcVar14 = sqlite3DbStrDup(db,(char *)z);
        *(char **)(pStmt + 0xa8) = pcVar14;
        uVar9 = sqlite3ApiExit(db,iVar11);
        *(uint *)(pStmt + 0x34) = uVar9;
      }
      else {
        *(undefined8 *)(pStmt + 0xa8) = 0;
        *(undefined4 *)(pStmt + 0x34) = 7;
        uVar9 = 7;
      }
LAB_00119550:
      if (db->mutex != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
      }
      return uVar9;
    }
    local_9c = local_9c + 1;
    sqlite3_reset(pStmt);
    if (-1 < iVar8) {
      pStmt[0xc5] = (sqlite3_stmt)0xfe;
    }
  } while( true );
}

Assistant:

SQLITE_API int sqlite3_step(sqlite3_stmt *pStmt){
  int rc = SQLITE_OK;      /* Result from sqlite3Step() */
  Vdbe *v = (Vdbe*)pStmt;  /* the prepared statement */
  int cnt = 0;             /* Counter to prevent infinite loop of reprepares */
  sqlite3 *db;             /* The database connection */

  if( vdbeSafetyNotNull(v) ){
    return SQLITE_MISUSE_BKPT;
  }
  db = v->db;
  sqlite3_mutex_enter(db->mutex);
  while( (rc = sqlite3Step(v))==SQLITE_SCHEMA
         && cnt++ < SQLITE_MAX_SCHEMA_RETRY ){
    int savedPc = v->pc;
    rc = sqlite3Reprepare(v);
    if( rc!=SQLITE_OK ){
      /* This case occurs after failing to recompile an sql statement.
      ** The error message from the SQL compiler has already been loaded
      ** into the database handle. This block copies the error message
      ** from the database handle into the statement and sets the statement
      ** program counter to 0 to ensure that when the statement is
      ** finalized or reset the parser error message is available via
      ** sqlite3_errmsg() and sqlite3_errcode().
      */
      const char *zErr = (const char *)sqlite3_value_text(db->pErr);
      sqlite3DbFree(db, v->zErrMsg);
      if( !db->mallocFailed ){
        v->zErrMsg = sqlite3DbStrDup(db, zErr);
        v->rc = rc = sqlite3ApiExit(db, rc);
      } else {
        v->zErrMsg = 0;
        v->rc = rc = SQLITE_NOMEM_BKPT;
      }
      break;
    }
    sqlite3_reset(pStmt);
    if( savedPc>=0 ){
      /* Setting minWriteFileFormat to 254 is a signal to the OP_Init and
      ** OP_Trace opcodes to *not* perform SQLITE_TRACE_STMT because it has
      ** already been done once on a prior invocation that failed due to
      ** SQLITE_SCHEMA.   tag-20220401a  */
      v->minWriteFileFormat = 254;
    }
    assert( v->expired==0 );
  }
  sqlite3_mutex_leave(db->mutex);
  return rc;
}